

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_NewScObject_A_Impl
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout,RegSlot *target)

{
  uint uVar1;
  VarArrayVarCount *pVVar2;
  Var pvVar3;
  ulong uVar4;
  long lVar5;
  
  pVVar2 = ByteCodeReader::ReadVarArrayVarCount
                     ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  uVar1 = TaggedInt::ToInt32(pVVar2->count);
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (lVar5 = 1; lVar5 - uVar4 != 1; lVar5 = lVar5 + 1) {
    SetOut(this,(ArgSlot)lVar5,pVVar2[lVar5].count);
  }
  pvVar3 = GetReg<unsigned_int>(this,(playout->super_OpLayoutAuxNoReg).C1);
  pvVar3 = NewScObject_Helper(this,pvVar3,(short)uVar1 + 1,(AuxArray<unsigned_int> *)0x0);
  SetReg<unsigned_int>(this,playout->R0,pvVar3);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScObject_A_Impl(const unaligned OpLayoutAuxiliary * playout, RegSlot *target)
    {
        const Js::VarArrayVarCount * vars = Js::ByteCodeReader::ReadVarArrayVarCount(playout->Offset, this->GetFunctionBody());

        int count = Js::TaggedInt::ToInt32(vars->count);

        // Push the parameters to stack
        for (int i = 0; i < count; i++)
        {
            SetOut((ArgSlot)(i + 1), vars->elements[i]);
        }

        Var newVarInstance = NewScObject_Helper(GetReg((RegSlot)playout->C1), (ArgSlot)count + 1);
        SetReg((RegSlot)playout->R0, newVarInstance);

    }